

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O0

float ON_Min(float a,float b)

{
  float local_18;
  float b_local;
  float a_local;
  
  b_local = a;
  if ((b < a) && (b_local = b, a <= b)) {
    local_18 = a;
    if (!NAN(b)) {
      local_18 = b;
    }
    b_local = local_18;
  }
  return b_local;
}

Assistant:

float ON_Min(float a, float b)
{
  if (a <= b)
    return a;
  if (b < a)
    return b;
  
  // If one is a NaN and the other isn't, return the valid value.
  return (!(b==b)) ? a : b;
}